

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall httplib::ThreadPool::worker::operator()(worker *this)

{
  ThreadPool *pTVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  byte bVar4;
  function<void_()> fn;
  unique_lock<std::mutex> lock;
  
  do {
    fn.super__Function_base._M_manager = (_Manager_type)0x0;
    fn._M_invoker = (_Invoker_type)0x0;
    fn.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    fn.super__Function_base._M_functor._8_8_ = 0;
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->pool_->mutex_);
    std::condition_variable::operator()(&this->pool_->cond_,&lock,(anon_class_8_1_8991fb9c)this);
    pTVar1 = this->pool_;
    p_Var2 = (pTVar1->jobs_).
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    bVar4 = p_Var2 == (_List_node_base *)&pTVar1->jobs_ & pTVar1->shutdown_;
    if (bVar4 == 0) {
      std::function<void_()>::operator=(&fn,(function<void_()> *)(p_Var2 + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(&this->pool_->jobs_);
    }
    bVar3 = bVar4 != 0;
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    if (bVar4 == 0) {
      if (fn.super__Function_base._M_manager == (_Manager_type)0x0) {
        __assert_fail("true == static_cast<bool>(fn)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h"
                      ,0x1c1,"void httplib::ThreadPool::worker::operator()()");
      }
      bVar3 = false;
      std::function<void_()>::operator()(&fn);
    }
    std::_Function_base::~_Function_base(&fn.super__Function_base);
  } while (!bVar3);
  return;
}

Assistant:

void operator()() {
      for (;;) {
        std::function<void()> fn;
        {
          std::unique_lock<std::mutex> lock(pool_.mutex_);

          pool_.cond_.wait(
              lock, [&] { return !pool_.jobs_.empty() || pool_.shutdown_; });

          if (pool_.shutdown_ && pool_.jobs_.empty()) { break; }

          fn = pool_.jobs_.front();
          pool_.jobs_.pop_front();
        }

        assert(true == static_cast<bool>(fn));
        fn();
      }
    }